

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O1

void validate(pfx_table *pfxt,uint32_t asn,char *prefix,uint8_t prefix_len,
             pfxv_state expected_result)

{
  int iVar1;
  long in_FS_OFFSET;
  pfxv_state val_res;
  lrtr_ip_addr ip;
  pfxv_state local_40;
  lrtr_ip_addr local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = lrtr_ip_str_to_addr(prefix,&local_3c);
  if (iVar1 != 0) {
    __assert_fail("!lrtr_ip_str_to_addr(prefix, &ip)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x1f,
                  "void validate(struct pfx_table *, uint32_t, const char *, uint8_t, enum pfxv_state)"
                 );
  }
  iVar1 = pfx_table_validate(pfxt,asn,&local_3c,prefix_len,&local_40);
  if (iVar1 != 0) {
    __assert_fail("pfx_table_validate(pfxt, asn, &ip, prefix_len, &val_res) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x21,
                  "void validate(struct pfx_table *, uint32_t, const char *, uint8_t, enum pfxv_state)"
                 );
  }
  if (local_40 != expected_result) {
    __assert_fail("val_res == expected_result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x23,
                  "void validate(struct pfx_table *, uint32_t, const char *, uint8_t, enum pfxv_state)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void validate(struct pfx_table *pfxt, uint32_t asn, const char *prefix, uint8_t prefix_len,
		     enum pfxv_state expected_result)
{
	struct lrtr_ip_addr ip;
	enum pfxv_state val_res;

	assert(!lrtr_ip_str_to_addr(prefix, &ip));

	assert(pfx_table_validate(pfxt, asn, &ip, prefix_len, &val_res) == PFX_SUCCESS);

	assert(val_res == expected_result);
}